

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

bool __thiscall QAccessibleTree::selectRow(QAccessibleTree *this,int row)

{
  char cVar1;
  SelectionBehavior SVar2;
  SelectionMode SVar3;
  int iVar4;
  QAbstractItemView *pQVar5;
  QItemSelectionModel *pQVar6;
  bool bVar7;
  long in_FS_OFFSET;
  QModelIndex QStack_78;
  QModelIndex local_60;
  QModelIndex local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = (QAbstractItemView *)QAccessibleTable::view(&this->super_QAccessibleTable);
  pQVar6 = QAbstractItemView::selectionModel(pQVar5);
  if (pQVar6 != (QItemSelectionModel *)0x0) {
    local_48.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    indexFromLogical(&local_48,this,row,0);
    bVar7 = false;
    if (((local_48.r < 0) || (bVar7 = false, (long)local_48._0_8_ < 0)) ||
       (local_48.m.ptr == (QAbstractItemModel *)0x0)) goto LAB_004dc814;
    pQVar5 = (QAbstractItemView *)QAccessibleTable::view(&this->super_QAccessibleTable);
    SVar2 = QAbstractItemView::selectionBehavior(pQVar5);
    if (SVar2 != SelectColumns) {
      pQVar5 = (QAbstractItemView *)QAccessibleTable::view(&this->super_QAccessibleTable);
      SVar3 = QAbstractItemView::selectionMode(pQVar5);
      if (SVar3 != NoSelection) {
        if (SVar3 == ContiguousSelection) {
          if (row != 0) {
            pQVar5 = (QAbstractItemView *)QAccessibleTable::view(&this->super_QAccessibleTable);
            pQVar6 = QAbstractItemView::selectionModel(pQVar5);
            pQVar5 = (QAbstractItemView *)QAccessibleTable::view(&this->super_QAccessibleTable);
            QAbstractItemView::rootIndex(&local_60,pQVar5);
            cVar1 = QItemSelectionModel::isRowSelected((int)pQVar6,(QModelIndex *)(ulong)(row - 1));
            if (cVar1 != '\0') goto LAB_004dc918;
          }
          pQVar5 = (QAbstractItemView *)QAccessibleTable::view(&this->super_QAccessibleTable);
          pQVar6 = QAbstractItemView::selectionModel(pQVar5);
          pQVar5 = (QAbstractItemView *)QAccessibleTable::view(&this->super_QAccessibleTable);
          QAbstractItemView::rootIndex(&QStack_78,pQVar5);
          cVar1 = QItemSelectionModel::isRowSelected((int)pQVar6,(QModelIndex *)(ulong)(row + 1));
          if (cVar1 == '\0') {
LAB_004dc908:
            pQVar5 = (QAbstractItemView *)QAccessibleTable::view(&this->super_QAccessibleTable);
            QAbstractItemView::clearSelection(pQVar5);
          }
        }
        else if (SVar3 == SingleSelection) {
          pQVar5 = (QAbstractItemView *)QAccessibleTable::view(&this->super_QAccessibleTable);
          SVar2 = QAbstractItemView::selectionBehavior(pQVar5);
          if ((SVar2 == SelectRows) ||
             (iVar4 = (**(code **)(*(long *)&this->super_QAccessibleTable + 0x58))(this), iVar4 < 2)
             ) goto LAB_004dc908;
          goto LAB_004dc812;
        }
LAB_004dc918:
        pQVar5 = (QAbstractItemView *)QAccessibleTable::view(&this->super_QAccessibleTable);
        pQVar6 = QAbstractItemView::selectionModel(pQVar5);
        (**(code **)(*(long *)pQVar6 + 0x68))(pQVar6,&local_48,0x22);
        bVar7 = true;
        goto LAB_004dc814;
      }
    }
  }
LAB_004dc812:
  bVar7 = false;
LAB_004dc814:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool QAccessibleTree::selectRow(int row)
{
    if (!view()->selectionModel())
        return false;
    QModelIndex index = indexFromLogical(row);

    if (!index.isValid() || view()->selectionBehavior() == QAbstractItemView::SelectColumns)
        return false;

    switch (view()->selectionMode()) {
    case QAbstractItemView::NoSelection:
        return false;
    case QAbstractItemView::SingleSelection:
        if ((view()->selectionBehavior() != QAbstractItemView::SelectRows) && (columnCount() > 1))
            return false;
        view()->clearSelection();
        break;
    case QAbstractItemView::ContiguousSelection:
        if ((!row || !view()->selectionModel()->isRowSelected(row - 1, view()->rootIndex()))
            && !view()->selectionModel()->isRowSelected(row + 1, view()->rootIndex()))
            view()->clearSelection();
        break;
    default:
        break;
    }

    view()->selectionModel()->select(index, QItemSelectionModel::Select | QItemSelectionModel::Rows);
    return true;
}